

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

void * btreeblk_alloc_sub(void *voidhandle,bid_t *bid)

{
  int iVar1;
  void *pvVar2;
  filemgr *in_RSI;
  btreeblk_handle *in_RDI;
  size_t idx;
  btreeblk_handle *handle;
  void *addr;
  int i;
  bid_t in_stack_00000030;
  void *in_stack_00000038;
  bid_t *in_stack_ffffffffffffffc8;
  ulong pos;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  btreeblk_handle *bid_00;
  void *in_stack_fffffffffffffff8;
  
  if (in_RDI->nsb == 0) {
    pvVar2 = btreeblk_alloc(in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    bid_00 = in_RDI;
    if (in_RDI->sb->bid != 0xffffffffffffffff) {
      iVar1 = filemgr_is_writable(in_RSI,CONCAT44(in_stack_ffffffffffffffe4,
                                                  in_stack_ffffffffffffffe0));
      if (iVar1 == 0) {
        for (pos = 0; pos < in_RDI->sb->nblocks; pos = pos + 1) {
          if (in_RDI->sb->bitmap[pos] == '\0') {
            _btreeblk_add_stale_block(in_RDI,pos,0);
          }
        }
      }
      else {
        for (iVar1 = 0; iVar1 < (int)(uint)in_RDI->sb->nblocks; iVar1 = iVar1 + 1) {
          if (in_RDI->sb->bitmap[iVar1] == '\0') {
            in_RDI->sb->bitmap[iVar1] = '\x01';
            bid2subbid(in_RDI->sb->bid,0,(long)iVar1,(bid_t *)in_RSI);
            pvVar2 = _btreeblk_read(in_stack_00000038,in_stack_00000030,voidhandle._4_4_);
            btreeblk_set_dirty((void *)idx,(bid_t)in_stack_fffffffffffffff8);
            return (void *)((long)pvVar2 + (ulong)(in_RDI->sb->sb_size * iVar1));
          }
        }
      }
    }
    pvVar2 = _btreeblk_alloc(in_stack_fffffffffffffff8,(bid_t *)bid_00,(int)((ulong)in_RSI >> 0x20))
    ;
    memset(in_RDI->sb->bitmap,0,(ulong)in_RDI->sb->nblocks);
    iVar1 = 0;
    *in_RDI->sb->bitmap = '\x01';
    bid2subbid(in_RDI->sb->bid,0,0,(bid_t *)in_RSI);
    pvVar2 = (void *)((long)pvVar2 + (ulong)(in_RDI->sb->sb_size * iVar1));
  }
  return pvVar2;
}

Assistant:

void * btreeblk_alloc_sub(void *voidhandle, bid_t *bid)
{
    int i;
    void *addr;
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;

    if (handle->nsb == 0) {
        return btreeblk_alloc(voidhandle, bid);
    }

    // check current block is available
    if (handle->sb[0].bid != BLK_NOT_FOUND) {
        if (filemgr_is_writable(handle->file, handle->sb[0].bid)) {
            // check if there is an empty slot
            for (i=0;i<handle->sb[0].nblocks;++i){
                if (handle->sb[0].bitmap[i] == 0) {
                    // return subblock
                    handle->sb[0].bitmap[i] = 1;
                    bid2subbid(handle->sb[0].bid, 0, i, bid);
                    addr = _btreeblk_read(voidhandle, handle->sb[0].bid, 0);
                    btreeblk_set_dirty(voidhandle, handle->sb[0].bid);
                    return (void*)
                           ((uint8_t*)addr +
                            handle->sb[0].sb_size * i);
                }
            }
        } else {
            // we have to mark all unused slots as stale
            size_t idx;
            for (idx=0; idx<handle->sb[0].nblocks; ++idx) {
                if (handle->sb[0].bitmap[idx] == 0) {
                    _btreeblk_add_stale_block(handle,
                        (handle->sb[0].bid * handle->nodesize)
                            + (idx * handle->sb[0].sb_size),
                        handle->sb[0].sb_size);
                }
            }
        }
    }

    // existing subblock cannot be used .. give it up & allocate new one
    addr = _btreeblk_alloc(voidhandle, &handle->sb[0].bid, 0);
    memset(handle->sb[0].bitmap, 0, handle->sb[0].nblocks);
    i = 0;
    handle->sb[0].bitmap[i] = 1;
    bid2subbid(handle->sb[0].bid, 0, i, bid);
    return (void*)((uint8_t*)addr + handle->sb[0].sb_size * i);
}